

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speaker_positioning.c
# Opt level: O1

int make_vbap_2d(vbap_data *data)

{
  byte bVar1;
  vbap_data *pvVar2;
  int i;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int j;
  ulong uVar6;
  ulong uVar7;
  vbap_data *pvVar8;
  ulong uVar9;
  float fVar10;
  double dVar11;
  float fVar12;
  float azimuth [33];
  int sorted [33];
  float local_148 [35];
  int iStack_bc;
  int local_b8;
  mixed_channel_t local_b4 [132];
  
  bVar1 = data->speaker_count;
  uVar7 = (ulong)bVar1;
  if (bVar1 != 0) {
    uVar9 = 0;
    pvVar2 = data;
    do {
      pvVar8 = (vbap_data *)(pvVar2->speakers[0] + 2);
      dVar11 = acos((double)pvVar2->speakers[0][0]);
      fVar10 = (float)((dVar11 * 360.0) / 6.283185307179586);
      local_148[uVar9] = fVar10;
      fVar12 = *(float *)pvVar8;
      if (0.001 <= ABS(fVar12) && ABS(fVar12) != 0.001) {
        local_148[uVar9] = fVar10 * (fVar12 / ABS(fVar12));
      }
      uVar9 = uVar9 + 1;
      pvVar2 = pvVar8;
    } while (uVar7 != uVar9);
  }
  if (bVar1 != 0) {
    uVar9 = 0;
    do {
      uVar6 = 0;
      uVar5 = 0;
      fVar12 = 1024.0;
      do {
        if (local_148[uVar6] < fVar12) {
          uVar5 = uVar6 & 0xffffffff;
          fVar12 = local_148[uVar6];
        }
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
      iVar3 = (int)uVar5;
      *(int *)(local_b4 + uVar9 * 4 + -4) = iVar3;
      local_148[iVar3] = local_148[iVar3] + 2048.0;
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar7);
    uVar9 = 0;
    do {
      local_148[uVar9] = local_148[uVar9] + -2048.0;
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  iVar3 = 0;
  if (1 < bVar1) {
    uVar9 = 0;
    iVar3 = 0;
    do {
      if (local_148[uVar9 + 1] - local_148[uVar9] <= 170.0) {
        data->sets[iVar3].speakers[0] = local_b4[uVar9 * 4 + -4];
        data->sets[iVar3].speakers[1] = local_b4[uVar9 * 4];
        data->sets[iVar3].speakers[2] = 0xff;
        iVar4 = compute_set_matrix_2d(iVar3,local_148,data);
        iVar3 = iVar4 + iVar3;
      }
      uVar9 = uVar9 + 1;
    } while (bVar1 - 1 != uVar9);
  }
  if ((360.0 - local_148[(&iStack_bc)[uVar7]]) + local_148[local_b8] <= 170.0) {
    data->sets[iVar3].speakers[0] = (mixed_channel_t)(&iStack_bc)[uVar7];
    data->sets[iVar3].speakers[1] = (mixed_channel_t)local_b8;
    data->sets[iVar3].speakers[2] = 0xff;
    iVar4 = compute_set_matrix_2d(iVar3,local_148,data);
    iVar3 = iVar4 + iVar3;
  }
  if (iVar3 == 0) {
    mixed_err(8);
  }
  else {
    data->set_count = iVar3;
  }
  return (uint)(iVar3 != 0);
}

Assistant:

int make_vbap_2d(struct vbap_data *data){
  mixed_channel_t speaker_count = data->speaker_count;
  int set_count = 0;

  // Get azimuth angles in [-180, +180]
  float azimuth[MIXED_MAX_SPEAKER_COUNT];
  for(int i=0; i<speaker_count; ++i){
    azimuth[i] = acos(data->speakers[i][0]) * RAD2DEG;
    if(0.001 < fabs(data->speakers[i][2])){
      azimuth[i] *= data->speakers[i][2] / fabs(data->speakers[i][2]);
    }
  }
  
  // Sort the speakers by angle
  int sorted[MIXED_MAX_SPEAKER_COUNT];
  for(int i=0; i<speaker_count; ++i){
    float smallest_angle = 1024.0;
    int smallest = 0;
    for(int j=0; j<speaker_count; ++j){
      if(azimuth[j] < smallest_angle){
        smallest_angle = azimuth[j];
        smallest = j;
      }
    }
    sorted[i] = smallest;
    // Bias this one to not get picked again.
    azimuth[smallest] += 2048.0;
  }
  // Undo the bias.
  for(int i=0; i<speaker_count; ++i){
    azimuth[i] -= 2048.0;
  }

  // Construct pairs based on adjacent speakers
  for(int i=0; i<speaker_count-1; ++i){
    if(azimuth[i+1] - azimuth[i] <= (170)){
      data->sets[set_count].speakers[0] = sorted[i];
      data->sets[set_count].speakers[1] = sorted[i+1];
      data->sets[set_count].speakers[2] = -1;
      if(compute_set_matrix_2d(set_count, azimuth, data)){
        ++set_count;
      }
    }
  }
  if(360 - azimuth[sorted[speaker_count-1]] + azimuth[sorted[0]] <= 170){
      data->sets[set_count].speakers[0] = sorted[speaker_count-1];
      data->sets[set_count].speakers[1] = sorted[0];
      data->sets[set_count].speakers[2] = -1;
      if(compute_set_matrix_2d(set_count, azimuth, data)){
        ++set_count;
      }
  }

  if(set_count == 0){
    mixed_err(MIXED_INVALID_VALUE);
    return 0;
  }
  
  data->set_count = set_count;
  return 1;
}